

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

void __thiscall IR::IndirOpnd::~IndirOpnd(IndirOpnd *this)

{
  undefined1 *puVar1;
  RegOpnd *pRVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014ed8b8;
  pRVar2 = this->m_baseOpnd;
  if (pRVar2 != (RegOpnd *)0x0) {
    if (((pRVar2->super_Opnd).field_0xb & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x2a,"(m_inUse)","Expected inUse to be set...");
      if (!bVar4) goto LAB_00620fc8;
      *puVar5 = 0;
    }
    puVar1 = &(pRVar2->super_Opnd).field_0xb;
    *puVar1 = *puVar1 & 0xfd;
    Opnd::Free(&this->m_baseOpnd->super_Opnd,this->m_func);
  }
  pRVar2 = this->m_indexOpnd;
  if (pRVar2 != (RegOpnd *)0x0) {
    if (((pRVar2->super_Opnd).field_0xb & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x2a,"(m_inUse)","Expected inUse to be set...");
      if (!bVar4) {
LAB_00620fc8:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    puVar1 = &(pRVar2->super_Opnd).field_0xb;
    *puVar1 = *puVar1 & 0xfd;
    Opnd::Free(&this->m_indexOpnd->super_Opnd,this->m_func);
  }
  return;
}

Assistant:

IndirOpnd::~IndirOpnd()
{
    if (m_baseOpnd != nullptr)
    {
        m_baseOpnd->UnUse();
        m_baseOpnd->Free(m_func);
    }
    if (m_indexOpnd != nullptr)
    {
        m_indexOpnd->UnUse();
        m_indexOpnd->Free(m_func);
    }
}